

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

void __thiscall CMenus::DoIcon(CMenus *this,int ImageId,int SpriteId,CUIRect *pRect,vec4 *pColor)

{
  IGraphics *pIVar1;
  float *in_RCX;
  int in_ESI;
  undefined8 in_RDI;
  CRenderTools *in_R8;
  long in_FS_OFFSET;
  CQuadItem QuadItem;
  undefined8 in_stack_ffffffffffffffb0;
  CQuadItem *this_00;
  CQuadItem local_1c;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = CComponent::Graphics((CComponent *)0x171bfc);
  local_c = g_pData->m_aImages[in_ESI].m_Id.m_Id;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])(pIVar1,(ulong)local_c);
  pIVar1 = CComponent::Graphics((CComponent *)0x171c37);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x17])();
  CComponent::RenderTools((CComponent *)0x171c4d);
  CRenderTools::SelectSprite
            (in_R8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0);
  if (in_R8 != (CRenderTools *)0x0) {
    pIVar1 = CComponent::Graphics((CComponent *)0x171c74);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x21])
              (*(float *)&in_R8->m_pConfig * *(float *)((long)&in_R8->m_pGraphics + 4),
               *(float *)((long)&in_R8->m_pConfig + 4) * *(float *)((long)&in_R8->m_pGraphics + 4),
               *(float *)&in_R8->m_pGraphics * *(float *)((long)&in_R8->m_pGraphics + 4),
               *(undefined4 *)((long)&in_R8->m_pGraphics + 4));
  }
  this_00 = &local_1c;
  IGraphics::CQuadItem::CQuadItem(this_00,*in_RCX,in_RCX[1],in_RCX[2],in_RCX[3]);
  pIVar1 = CComponent::Graphics((CComponent *)0x171cf6);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,this_00,1);
  pIVar1 = CComponent::Graphics((CComponent *)0x171d19);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMenus::DoIcon(int ImageId, int SpriteId, const CUIRect *pRect, const vec4 *pColor)
{
	Graphics()->TextureSet(g_pData->m_aImages[ImageId].m_Id);

	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SpriteId);
	if(pColor)
	{
		Graphics()->SetColor(pColor->r*pColor->a, pColor->g*pColor->a, pColor->b*pColor->a, pColor->a);
	}
	IGraphics::CQuadItem QuadItem(pRect->x, pRect->y, pRect->w, pRect->h);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
}